

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderVariableManagerGL::
GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>::SetDynamicOffset
          (GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo> *this,
          Uint32 ArrayIndex,Uint32 Offset)

{
  string msg;
  
  FormatString<char[63]>
            (&msg,(char (*) [63])"Dynamic offset may only be set for uniform and storage buffers");
  DebugAssertionFailed
            (msg._M_dataplus._M_p,"SetDynamicOffset",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
             ,0x73);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void SetDynamicOffset(Uint32 ArrayIndex, Uint32 Offset)
        {
            UNSUPPORTED("Dynamic offset may only be set for uniform and storage buffers");
        }